

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::prim::print_primspec_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,PrimSpec *primspec,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  Specifier *pSVar3;
  ulong uVar4;
  string *psVar5;
  PrimMeta *pPVar6;
  PropertyMap *props;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *pvVar7;
  size_type sVar8;
  const_reference this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *vslist;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar9;
  uint32_t n_02;
  uint32_t n_03;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  ulong local_290;
  size_t i;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  PrimSpec *pPStack_18;
  uint32_t indent_local;
  PrimSpec *primspec_local;
  
  local_1c = (uint)primspec;
  pPStack_18 = (PrimSpec *)this;
  primspec_local = (PrimSpec *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  pSVar3 = PrimSpec::specifier(pPStack_18);
  tinyusdz::to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*pSVar3,s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  ::std::operator<<(poVar2," ");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  PrimSpec::typeName_abi_cxx11_(pPStack_18);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = PrimSpec::typeName_abi_cxx11_(pPStack_18);
    bVar1 = ::std::operator==(psVar5,"Model");
    if (!bVar1) {
      psVar5 = PrimSpec::typeName_abi_cxx11_(pPStack_18);
      poVar2 = ::std::operator<<(aoStack_198,(string *)psVar5);
      ::std::operator<<(poVar2," ");
    }
  }
  poVar2 = ::std::operator<<(aoStack_198,"\"");
  psVar5 = PrimSpec::name_abi_cxx11_(pPStack_18);
  poVar2 = ::std::operator<<(poVar2,(string *)psVar5);
  ::std::operator<<(poVar2,"\"\n");
  pPVar6 = PrimSpec::metas(pPStack_18);
  bVar1 = PrimMetas::authored(pPVar6);
  uVar9 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    pPVar6 = PrimSpec::metas(pPStack_18);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)pPVar6,(PrimMeta *)(ulong)(local_1c + 1),indent);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    uVar9 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar9);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  props = PrimSpec::props_abi_cxx11_(pPStack_18);
  print_props((string *)&i,props,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&i);
  ::std::__cxx11::string::~string((string *)&i);
  local_290 = 0;
  while( true ) {
    uVar4 = local_290;
    pvVar7 = PrimSpec::children(pPStack_18);
    sVar8 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::size(pvVar7);
    if (sVar8 <= uVar4) break;
    if (local_290 != 0) {
      pprint::Indent_abi_cxx11_(&local_2b0,(pprint *)(ulong)local_1c,n_02);
      poVar2 = ::std::operator<<(aoStack_198,(string *)&local_2b0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_2b0);
    }
    uVar9 = (uint32_t)sVar8;
    pvVar7 = PrimSpec::children(pPStack_18);
    this_00 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator[]
                        (pvVar7,local_290);
    print_primspec_abi_cxx11_(&local_2d0,(prim *)this_00,(PrimSpec *)(ulong)(local_1c + 1),uVar9);
    ::std::operator<<(aoStack_198,(string *)&local_2d0);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    local_290 = local_290 + 1;
  }
  vslist = PrimSpec::variantSets_abi_cxx11_(pPStack_18);
  print_variantSetSpecStmt(&local_2f0,vslist,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_2f0);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)local_1c,n_03);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_310);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::~string((string *)&local_310);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_primspec(const PrimSpec &primspec, const uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(primspec.specifier()) << " ";
  if (primspec.typeName().empty() || primspec.typeName() == "Model") {
    // do not emit typeName
  } else {
    ss << primspec.typeName() << " ";
  }

  ss << "\"" << primspec.name() << "\"\n";

  if (primspec.metas().authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(primspec.metas(), indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_props(primspec.props(), indent + 1);

  // TODO: print according to primChildren metadatum
  for (size_t i = 0; i < primspec.children().size(); i++) {
    if (i > 0) {
      ss << pprint::Indent(indent) << "\n";
    }
    ss << print_primspec(primspec.children()[i], indent + 1);
  }

  // ss << "# variant \n";
  ss << print_variantSetSpecStmt(primspec.variantSets(), indent + 1);

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}